

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_ins(jit_State *J)

{
  MMS MVar1;
  BCIns *pBVar2;
  SnapEntry *pSVar3;
  MMS *pc_00;
  GCobj *o;
  IRRef1 IVar4;
  TRef TVar5;
  MMS op_00;
  int iVar6;
  LoopEvent LVar7;
  SnapShot *pSVar8;
  anon_struct_8_2_7fa0a05d_for_TValue_4 *paVar9;
  TValue *pTVar10;
  uint uVar11;
  MMS mm_00;
  bool bVar12;
  bool local_549;
  TRef local_4c4;
  TRef local_4c0;
  TRef local_4bc;
  uint local_4a8;
  uint local_4a4;
  TRef local_498;
  TRef local_494;
  TRef local_484;
  TRef local_47c;
  TValue *b;
  MMS mm;
  int diff;
  int irop;
  IRType tc;
  IRType ta;
  GCstr *s_2;
  cTValue *tv_2;
  TValue *tv_1;
  BCReg s_1;
  TValue *tv;
  BCReg s;
  SnapShot *snap;
  uint local_410;
  TRef rc;
  TRef rb;
  TRef ra;
  BCOp op;
  BCIns ins;
  BCIns *pc;
  RecordIndex ix;
  cTValue *lbase;
  jit_State *J_local;
  
  if (J->postproc != LJ_POST_NONE) {
    switch(J->postproc) {
    case LJ_POST_FIXCOMP:
      pBVar2 = *(BCIns **)&J[-1].penalty[0x31].val;
      rec_comp_fixup(J,pBVar2,(uint)(((uint)((long)J[-1].penalty[0x32].pc.ptr64 >> 0x2f) <
                                      0xfffffffe ^ 0xffU) & 1) ^ *pBVar2 & 1);
    case LJ_POST_FIXGUARD:
    case LJ_POST_FIXGUARDSNAP:
      if ((0xfffffffd < (uint)((long)J[-1].penalty[0x32].pc.ptr64 >> 0x2f)) &&
         ((J->fold).ins.field_1.o = (J->fold).ins.field_1.o ^ 1, J->postproc == LJ_POST_FIXGUARDSNAP
         )) {
        pSVar8 = (J->cur).snap + (int)((J->cur).nsnap - 1);
        pSVar3 = (J->cur).snapmap;
        uVar11 = (pSVar8->mapofs + (uint)pSVar8->nent) - 1;
        pSVar3[uVar11] = pSVar3[uVar11] - 1;
      }
      lj_opt_fold(J);
    case LJ_POST_FIXBOOL:
      if (0xfffffffd < (uint)((long)J[-1].penalty[0x32].pc.ptr64 >> 0x2f)) {
        for (tv._4_4_ = 0; tv._4_4_ < J->maxslot; tv._4_4_ = tv._4_4_ + 1) {
          if ((J->base[tv._4_4_] == 0x2007ffd) &&
             ((int)J->L->base[tv._4_4_].field_4.it >> 0xf == -2)) {
            J->base[tv._4_4_] = 0x1007ffe;
            break;
          }
        }
      }
      break;
    case LJ_POST_FIXCONST:
      pTVar10 = J->L->base;
      for (tv_1._4_4_ = 0; tv_1._4_4_ < J->maxslot; tv_1._4_4_ = tv_1._4_4_ + 1) {
        if ((J->base[tv_1._4_4_] == 0x7fff) && (pTVar10[tv_1._4_4_].u64 != 0xffffffffffffffff)) {
          TVar5 = lj_record_constify(J,pTVar10 + tv_1._4_4_);
          J->base[tv_1._4_4_] = TVar5;
        }
      }
      break;
    case LJ_POST_FFRETRY:
      if (0x60 < (*J->pc & 0xff)) {
        return;
      }
    }
    J->postproc = LJ_POST_NONE;
  }
  if (J->needsnap != '\0') {
    J->needsnap = '\0';
    if (J->pt != (GCproto *)0x0) {
      lj_snap_purge(J);
    }
    lj_snap_add(J);
    J->mergesnap = '\x01';
  }
  if (J->bcskip != '\0') {
    J->bcskip = J->bcskip + 0xff;
    return;
  }
  pc_00 = J->pc;
  if ((J->framedepth == 0) && (J->bc_extent <= (uint)((int)pc_00 - (int)J->bc_min))) {
    lj_trace_err(J,LJ_TRERR_LLEAVE);
  }
  rec_profile_ins(J,pc_00);
  ix._64_8_ = J->L->base;
  MVar1 = *pc_00;
  op_00 = MVar1 & 0xff;
  rc = MVar1 >> 8 & 0xff;
  ix.tab = 0;
  if ((lj_bc_mode[op_00] & 7) == 3) {
    ix.keyv = *(TValue *)(ix._64_8_ + (ulong)rc * 8);
    if (J->base[rc] == 0) {
      local_47c = sload(J,rc);
    }
    else {
      local_47c = J->base[rc];
    }
    rc = local_47c;
    ix.tab = local_47c;
  }
  local_410 = MVar1 >> 0x18;
  snap._4_4_ = MVar1 >> 0x10 & 0xff;
  if ((lj_bc_mode[op_00] >> 3 & 0xf) == 0) {
    local_410 = 0;
    snap._4_4_ = MVar1 >> 0x10;
  }
  else if ((lj_bc_mode[op_00] >> 3 & 0xf) == 3) {
    pc = *(BCIns **)(ix._64_8_ + (ulong)local_410 * 8);
    if (J->base[local_410] == 0) {
      local_484 = sload(J,local_410);
    }
    else {
      local_484 = J->base[local_410];
    }
    local_410 = local_484;
    ix.oldv._0_4_ = local_484;
  }
  switch(lj_bc_mode[op_00] >> 7 & 0xf) {
  case 3:
    ix.tabv = *(TValue *)(ix._64_8_ + (ulong)snap._4_4_ * 8);
    if (J->base[snap._4_4_] == 0) {
      local_494 = sload(J,snap._4_4_);
    }
    else {
      local_494 = J->base[snap._4_4_];
    }
    snap._4_4_ = local_494;
    ix.oldv._4_4_ = local_494;
    break;
  default:
    break;
  case 8:
    ix.tabv.u64 = (ulong)snap._4_4_ << 0x2f ^ 0xffffffffffffffff;
    snap._4_4_ = snap._4_4_ * 0xffffff + 0x7fff;
    ix.oldv._4_4_ = snap._4_4_;
    break;
  case 9:
    paVar9 = (anon_struct_8_2_7fa0a05d_for_TValue_4 *)((J->pt->k).ptr64 + (ulong)snap._4_4_ * 8);
    ix.tabv.field_4 = *paVar9;
    if (paVar9->it == 0xfffe7fff) {
      TVar5 = lj_ir_kint(J,0);
      local_498 = TVar5 | 0x100000;
    }
    else {
      local_498 = lj_ir_knumint(J,(lua_Number)*paVar9);
    }
    snap._4_4_ = local_498;
    ix.oldv._4_4_ = local_498;
    break;
  case 10:
    o = *(GCobj **)((J->pt->k).ptr64 + ((ulong)snap._4_4_ ^ 0xffffffffffffffff) * 8);
    ix.tabv.u64 = (ulong)o | 0xfffd800000000000;
    snap._4_4_ = lj_ir_kgc(J,o,IRT_STR);
    ix.oldv._4_4_ = snap._4_4_;
  }
  pBVar2 = pc;
  uVar11 = snap._4_4_;
  IVar4 = (IRRef1)snap._4_4_;
  switch(op_00) {
  case MM_index:
  case MM_newindex:
  case MM_gc:
  case MM_mode:
    if (((rc & 0x1f000000) == 0xa000000) || ((snap._4_4_ & 0x1f000000) == 0xa000000)) {
      mm_00 = MM_lt;
      if ((MVar1 & MM_gc) != MM_index) {
        mm_00 = MM_le;
      }
      rec_mm_comp_cdata(J,(RecordIndex *)&pc,op_00,mm_00);
    }
    else if (((0x7fff < ((rc | snap._4_4_) & 0xffff)) ||
             ((5 < (rc >> 0x18 & 0x1f) - 0xe && ((rc & 0x1f000000) != 0x4000000)))) ||
            ((5 < (snap._4_4_ >> 0x18 & 0x1f) - 0xe && ((snap._4_4_ & 0x1f000000) != 0x4000000)))) {
      if ((rc >> 0x18 & 0x1f) - 0xf < 5) {
        local_4a4 = 0x13;
      }
      else {
        local_4a4 = rc >> 0x18 & 0x1f;
      }
      irop = local_4a4;
      if ((snap._4_4_ >> 0x18 & 0x1f) - 0xf < 5) {
        local_4a8 = 0x13;
      }
      else {
        local_4a8 = snap._4_4_ >> 0x18 & 0x1f;
      }
      if (local_4a4 != local_4a8) {
        if ((local_4a4 == 0x13) && (local_4a8 == 0xe)) {
          (J->fold).ins.field_0.ot = 0x5b0e;
          (J->fold).ins.field_0.op1 = (IRRef1)rc;
          (J->fold).ins.field_0.op2 = 0x1d3;
          rc = lj_opt_fold(J);
          irop = 0xe;
        }
        else if ((local_4a4 == 0xe) && (local_4a8 == 0x13)) {
          (J->fold).ins.field_0.ot = 0x5b0e;
          (J->fold).ins.field_0.op1 = IVar4;
          (J->fold).ins.field_0.op2 = 0x1d3;
          snap._4_4_ = lj_opt_fold(J);
        }
        else if (((local_4a4 != 1) && (local_4a4 != 2)) || ((local_4a8 != 1 && (local_4a8 != 2))))
        break;
      }
      rec_comp_prep(J);
      mm = op_00;
      if (irop == 0xe) {
        if ((MVar1 & MM_newindex) != MM_index) {
          mm = op_00 ^ MM_eq;
        }
        iVar6 = lj_ir_numcmp(ix.keyv.n,ix.tabv.n,mm);
        if (iVar6 == 0) {
          mm = mm ^ MM_FAST;
        }
      }
      else if (irop == 0x13) {
        iVar6 = lj_ir_numcmp(ix.keyv.n,ix.tabv.n,op_00);
        if (iVar6 == 0) {
          mm = op_00 ^ MM_newindex;
        }
      }
      else {
        if (irop != 4) {
          rec_mm_comp(J,(RecordIndex *)&pc,op_00);
          break;
        }
        iVar6 = lj_ir_strcmp((GCstr *)(ix.keyv.u64 & 0x7fffffffffff),
                             (GCstr *)(ix.tabv.u64 & 0x7fffffffffff),op_00);
        if (iVar6 == 0) {
          mm = op_00 ^ MM_newindex;
        }
        rc = lj_ir_call(J,IRCALL_lj_str_cmp,(ulong)rc,(ulong)snap._4_4_);
        snap._4_4_ = lj_ir_kint(J,0);
        irop._0_2_ = 0x13;
      }
      (J->fold).ins.field_0.ot = (ushort)(mm << 8) | (ushort)irop | 0x80;
      (J->fold).ins.field_0.op1 = (IRRef1)rc;
      (J->fold).ins.field_0.op2 = (IRRef1)snap._4_4_;
      lj_opt_fold(J);
      rec_comp_fixup(J,J->pc,(op_00 ^ mm) & MM_newindex);
    }
    break;
  case MM_eq:
  case MM_FAST:
  case MM_lt:
  case MM_le:
  case MM_concat:
  case MM_call:
  case MM_add:
  case MM_sub:
    if (((rc & 0x1f000000) == 0xa000000) || ((snap._4_4_ & 0x1f000000) == 0xa000000)) {
      rec_mm_comp_cdata(J,(RecordIndex *)&pc,op_00,MM_eq);
    }
    else if (((0x7fff < ((rc | snap._4_4_) & 0xffff)) || ((rc & 0x1f000000) == 0xb000000)) ||
            ((rc & 0x1f000000) == 0xc000000)) {
      rec_comp_prep(J);
      iVar6 = lj_record_objcmp(J,rc,snap._4_4_,&ix.keyv,&ix.tabv);
      if ((iVar6 == 2) || (((rc & 0x1f000000) != 0xb000000 && ((rc & 0x1f000000) != 0xc000000)))) {
        rec_comp_fixup(J,J->pc,(uint)((MVar1 & MM_newindex) == (uint)(iVar6 == 0)));
      }
      else if (iVar6 == 1) {
        rec_mm_equal(J,(RecordIndex *)&pc,op_00);
      }
    }
    break;
  case MM_mul:
  case MM_div:
    if ((MVar1 & MM_newindex) == (uint)(1 < (snap._4_4_ >> 0x18 & 0x1f))) {
      snap._4_4_ = 0;
    }
  case MM_mod:
  case MM_pow:
    if ((pc_00[1] >> 8 & 0xff) < J->maxslot) {
      J->maxslot = pc_00[1] >> 8 & 0xff;
    }
    break;
  case MM_unm:
  case MM_metatable:
    if (snap._4_4_ == 0xf) {
      rc = lj_ir_tonum(J,rc);
    }
    else if (snap._4_4_ == 5) {
      rc = lj_ir_tostr(J,rc);
    }
    J->base[MVar1 >> 8 & 0xff] = rc;
    break;
  case MM_tostring:
    if (J->maxslot < rc) {
      memset(J->base + J->maxslot,0,(ulong)(rc - J->maxslot) << 2);
    }
    break;
  case MM_new:
    uVar11 = snap._4_4_ >> 0x18;
    snap._4_4_ = 0x2007ffd;
    if (1 < (uVar11 & 0x1f)) {
      snap._4_4_ = 0x1007ffe;
    }
    break;
  case MM_pairs:
    if (((snap._4_4_ >> 0x18 & 0x1f) - 0xe < 6) || ((snap._4_4_ & 0x1f000000) == 0x4000000)) {
      snap._4_4_ = lj_opt_narrow_unm(J,snap._4_4_,&ix.tabv);
    }
    else {
      ix.oldv._0_4_ = snap._4_4_;
      pc = (BCIns *)ix.tabv;
      snap._4_4_ = rec_mm_arith(J,(RecordIndex *)&pc,MM_unm);
    }
    break;
  case MM_ipairs:
    if ((snap._4_4_ & 0x1f000000) == 0x4000000) {
      (J->fold).ins.field_0.ot = 0x4513;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = 0;
      snap._4_4_ = lj_opt_fold(J);
    }
    else if ((snap._4_4_ & 0x1f000000) == 0xb000000) {
      (J->fold).ins.field_0.ot = 0x4913;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = 0x7fff;
      snap._4_4_ = lj_opt_fold(J);
    }
    else {
      snap._4_4_ = rec_mm_len(J,snap._4_4_,&ix.tabv);
    }
    break;
  case MM_unm|MM_add:
  case 0x24:
LAB_0019761d:
    if ((((local_410 >> 0x18 & 0x1f) - 0xe < 6) || ((local_410 & 0x1f000000) == 0x4000000)) &&
       (((snap._4_4_ >> 0x18 & 0x1f) - 0xe < 6 || ((snap._4_4_ & 0x1f000000) == 0x4000000)))) {
      snap._4_4_ = lj_opt_narrow_mod(J,local_410,snap._4_4_,(TValue *)&pc,&ix.tabv);
    }
    else {
      snap._4_4_ = rec_mm_arith(J,(RecordIndex *)&pc,MM_mod);
    }
    break;
  case MM_unm|MM_sub:
  case MM_unm|MM_mul:
  case MM_unm|MM_div:
  case MM_unm|MM_mod:
  case MM_unm|MM_pow:
    ix.oldv._0_4_ = snap._4_4_;
    snap._4_4_ = local_410;
    ix.oldv._4_4_ = local_410;
    local_410 = uVar11;
    pc = (BCIns *)ix.tabv;
    ix.tabv = (TValue)pBVar2;
    if (op_00 == (MM_unm|MM_pow)) goto LAB_0019761d;
  case MM__MAX:
  case MM__MAX|MM_newindex:
  case MM_unm|MM_concat:
  case MM_unm|MM_call:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
    if ((((local_410 >> 0x18 & 0x1f) - 0xe < 6) || ((local_410 & 0x1f000000) == 0x4000000)) &&
       (((snap._4_4_ >> 0x18 & 0x1f) - 0xe < 6 || ((snap._4_4_ & 0x1f000000) == 0x4000000)))) {
      snap._4_4_ = lj_opt_narrow_arith(J,local_410,snap._4_4_,(TValue *)&pc,&ix.tabv,
                                       ((int)(uint)lj_bc_mode[op_00] >> 0xb) + (MM_unm|MM_pow));
    }
    else {
      snap._4_4_ = rec_mm_arith(J,(RecordIndex *)&pc,(int)(uint)lj_bc_mode[op_00] >> 0xb);
    }
    break;
  case 0x25:
    if ((((local_410 >> 0x18 & 0x1f) - 0xe < 6) || ((local_410 & 0x1f000000) == 0x4000000)) &&
       (((snap._4_4_ >> 0x18 & 0x1f) - 0xe < 6 || ((snap._4_4_ & 0x1f000000) == 0x4000000)))) {
      snap._4_4_ = lj_opt_narrow_arith(J,local_410,snap._4_4_,(TValue *)&pc,&ix.tabv,IR_POW);
    }
    else {
      snap._4_4_ = rec_mm_arith(J,(RecordIndex *)&pc,MM_pow);
    }
    break;
  case 0x26:
    snap._4_4_ = rec_cat(J,local_410,snap._4_4_);
    break;
  case 0x27:
  case 0x2a:
  case 0x2b:
    break;
  case 0x28:
    snap._4_4_ = lj_ir_kgc(J,*(GCobj **)
                              ((J->pt->k).ptr64 + ((ulong)snap._4_4_ ^ 0xffffffffffffffff) * 8),
                           IRT_CDATA);
    break;
  case 0x29:
    snap._4_4_ = lj_ir_kint(J,(int)(short)IVar4);
    break;
  case 0x2c:
    if (J->maxslot < rc) {
      J->base[rc - 1] = 0;
    }
    while (rc <= snap._4_4_) {
      J->base[rc] = 0x7fff;
      rc = rc + 1;
    }
    if (J->maxslot <= snap._4_4_) {
      J->maxslot = snap._4_4_ + 1;
    }
    break;
  case 0x2d:
    snap._4_4_ = rec_upvalue(J,snap._4_4_,0);
    break;
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
    rec_upvalue(J,rc,snap._4_4_);
    break;
  case 0x32:
  case 0x33:
switchD_001969a5_caseD_32:
    (J->errinfo).n = (double)op_00;
    lj_trace_err_info(J,LJ_TRERR_NYIBC);
  case 0x34:
    snap._4_4_ = rec_tnew(J,snap._4_4_);
    break;
  case 0x35:
    TVar5 = lj_ir_kgc(J,*(GCobj **)((J->pt->k).ptr64 + ((ulong)snap._4_4_ ^ 0xffffffffffffffff) * 8)
                      ,IRT_TAB);
    (J->fold).ins.field_0.ot = 0x528b;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = 0;
    snap._4_4_ = lj_opt_fold(J);
    break;
  case 0x36:
  case 0x37:
    pc = (BCIns *)((J->fn->c).env.gcptr64 | 0xfffa000000000000);
    TVar5 = getcurrf(J);
    (J->fold).ins.field_0.ot = 0x450b;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = 1;
    ix.oldv._0_4_ = lj_opt_fold(J);
    ix.mt = 100;
    snap._4_4_ = lj_record_idx(J,(RecordIndex *)&pc);
    break;
  case 0x3a:
  case 0x3e:
    ix.tabv.n = (lua_Number)(int)snap._4_4_;
    ix.oldv._4_4_ = lj_ir_kint(J,snap._4_4_);
  case 0x38:
  case 0x39:
  case 0x3c:
  case 0x3d:
    ix.mt = 100;
    snap._4_4_ = lj_record_idx(J,(RecordIndex *)&pc);
    break;
  case 0x3b:
  case 0x40:
    ix.mt = 0;
    snap._4_4_ = lj_record_idx(J,(RecordIndex *)&pc);
    break;
  case 0x3f:
    rec_tsetm(J,rc,(BCReg)((long)J->L->top - (long)J->L->base >> 3),ix.tabv.field_4.i);
    J->maxslot = rc;
    break;
  case 0x41:
    snap._4_4_ = ((int)((long)J->L->top - (long)J->L->base >> 3) - rc) - 1;
  case 0x42:
    lj_record_call(J,rc,(ulong)snap._4_4_ - 1);
    break;
  case 0x43:
    snap._4_4_ = ((int)((long)J->L->top - (long)J->L->base >> 3) - rc) - 1;
  case 0x44:
    lj_record_tailcall(J,rc,(ulong)snap._4_4_ - 1);
    break;
  case 0x45:
    if (J->base[rc - 3] == 0) {
      local_4bc = sload(J,rc - 3);
    }
    else {
      local_4bc = J->base[rc - 3];
    }
    J->base[rc] = local_4bc;
    if (J->base[rc - 2] == 0) {
      local_4c0 = sload(J,rc - 2);
    }
    else {
      local_4c0 = J->base[rc - 2];
    }
    J->base[rc + 2] = local_4c0;
    if (J->base[rc - 1] == 0) {
      local_4c4 = sload(J,rc - 1);
    }
    else {
      local_4c4 = J->base[rc - 1];
    }
    J->base[rc + 3] = local_4c4;
    pTVar10 = J->L->base + rc;
    *pTVar10 = pTVar10[-3];
    pTVar10[2] = pTVar10[-2];
    pTVar10[3] = pTVar10[-1];
    lj_record_call(J,rc,(ulong)snap._4_4_ - 1);
    break;
  case 0x46:
    LVar7 = rec_itern(J,rc,local_410);
    rec_loop_interp(J,pc_00,LVar7);
    break;
  case 0x47:
    rec_varg(J,rc,(ulong)local_410 - 1);
    break;
  case 0x48:
    rec_isnext(J,rc);
    break;
  case 0x49:
    snap._4_4_ = ((int)((long)J->L->top - (long)J->L->base >> 3) - rc) + 1;
  case 0x4a:
  case 0x4b:
  case 0x4c:
    rec_profile_ret(J);
    lj_record_ret(J,rc,(ulong)snap._4_4_ - 1);
    break;
  case 0x4d:
    LVar7 = rec_for(J,pc_00,0);
    if (LVar7 != LOOPEV_LEAVE) {
      J->loopref = (J->cur).nins;
    }
    break;
  case 0x4e:
    LVar7 = rec_for(J,pc_00,0);
    if (LVar7 != LOOPEV_LEAVE) {
      lj_record_stop(J,LJ_TRLINK_ROOT,pc_00[(ulong)snap._4_4_ - 0x8000] >> 0x10);
    }
    break;
  case 0x4f:
    LVar7 = rec_for(J,pc_00 + ((ulong)snap._4_4_ - 0x8000),1);
    rec_loop_interp(J,pc_00,LVar7);
    break;
  case 0x50:
  case 0x53:
  case 0x56:
  case 0x5a:
  case 0x5d:
    lj_trace_err(J,LJ_TRERR_BLACKL);
  case 0x51:
    LVar7 = rec_for(J,pc_00 + ((ulong)(*(uint *)(J->trace[snap._4_4_].gcptr64 + 0x50) >> 0x10) -
                              0x8000),1);
    rec_loop_jit(J,snap._4_4_,LVar7);
    break;
  case 0x52:
    LVar7 = rec_iterl(J,*pc_00);
    rec_loop_interp(J,pc_00,LVar7);
    break;
  case 0x54:
    LVar7 = rec_iterl(J,*(BCIns *)(J->trace[snap._4_4_].gcptr64 + 0x50));
    rec_loop_jit(J,snap._4_4_,LVar7);
    break;
  case 0x55:
    LVar7 = rec_loop(J,rc,1);
    rec_loop_interp(J,pc_00,LVar7);
    break;
  case 0x57:
    uVar11 = *(uint *)(J->trace[snap._4_4_].gcptr64 + 0x50) & 0xff;
    bVar12 = true;
    if (((uVar11 != 0x49) && (bVar12 = true, uVar11 != 0x4a)) && (bVar12 = true, uVar11 != 0x4b)) {
      bVar12 = uVar11 == 0x4c;
    }
    local_549 = false;
    if (!bVar12) {
      local_549 = (*(uint *)(J->trace[snap._4_4_].gcptr64 + 0x50) & 0xff) != 0x46;
    }
    LVar7 = rec_loop(J,rc,(uint)local_549);
    rec_loop_jit(J,snap._4_4_,LVar7);
    break;
  case 0x58:
    if (rc < J->maxslot) {
      J->maxslot = rc;
    }
    break;
  case 0x59:
    rec_func_lua(J);
    break;
  case 0x5b:
    rec_func_jit(J,snap._4_4_);
    break;
  case 0x5c:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case 0x5e:
    break;
  case 0x5f:
  case 0x60:
    lj_ffrecord_func(J);
    break;
  default:
    if (op_00 < 0x61) goto switchD_001969a5_caseD_32;
    lj_ffrecord_func(J);
  }
  if ((((lj_bc_mode[op_00] & 7) == 1) && (snap._4_4_ != 0)) &&
     (J->base[rc] = snap._4_4_, J->maxslot <= rc)) {
    if (J->maxslot < rc) {
      J->base[rc - 1] = 0;
    }
    J->maxslot = rc + 1;
  }
  if (((J->cur).nins <= J->param[1] + 0x8001U) && (0x8000U - J->param[2] <= (J->cur).nk)) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_TRACEOV);
}

Assistant:

void lj_record_ins(jit_State *J)
{
  cTValue *lbase;
  RecordIndex ix;
  const BCIns *pc;
  BCIns ins;
  BCOp op;
  TRef ra, rb, rc;

  /* Perform post-processing action before recording the next instruction. */
  if (LJ_UNLIKELY(J->postproc != LJ_POST_NONE)) {
    switch (J->postproc) {
    case LJ_POST_FIXCOMP:  /* Fixup comparison. */
      pc = (const BCIns *)(uintptr_t)J2G(J)->tmptv.u64;
      rec_comp_fixup(J, pc, (!tvistruecond(&J2G(J)->tmptv2) ^ (bc_op(*pc)&1)));
      /* fallthrough */
    case LJ_POST_FIXGUARD:  /* Fixup and emit pending guard. */
    case LJ_POST_FIXGUARDSNAP:  /* Fixup and emit pending guard and snapshot. */
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	J->fold.ins.o ^= 1;  /* Flip guard to opposite. */
	if (J->postproc == LJ_POST_FIXGUARDSNAP) {
	  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
	  J->cur.snapmap[snap->mapofs+snap->nent-1]--;  /* False -> true. */
	}
      }
      lj_opt_fold(J);  /* Emit pending guard. */
      /* fallthrough */
    case LJ_POST_FIXBOOL:
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Fixup stack slot (if any). */
	  if (J->base[s] == TREF_TRUE && tvisfalse(&tv[s])) {
	    J->base[s] = TREF_FALSE;
	    break;
	  }
      }
      break;
    case LJ_POST_FIXCONST:
      {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Constify stack slots (if any). */
	  if (J->base[s] == TREF_NIL && !tvisnil(&tv[s]))
	    J->base[s] = lj_record_constify(J, &tv[s]);
      }
      break;
    case LJ_POST_FFRETRY:  /* Suppress recording of retried fast function. */
      if (bc_op(*J->pc) >= BC__MAX)
	return;
      break;
    default: lj_assertJ(0, "bad post-processing mode"); break;
    }
    J->postproc = LJ_POST_NONE;
  }

  /* Need snapshot before recording next bytecode (e.g. after a store). */
  if (J->needsnap) {
    J->needsnap = 0;
    if (J->pt) lj_snap_purge(J);
    lj_snap_add(J);
    J->mergesnap = 1;
  }

  /* Skip some bytecodes. */
  if (LJ_UNLIKELY(J->bcskip > 0)) {
    J->bcskip--;
    return;
  }

  /* Record only closed loops for root traces. */
  pc = J->pc;
  if (J->framedepth == 0 &&
     (MSize)((char *)pc - (char *)J->bc_min) >= J->bc_extent)
    lj_trace_err(J, LJ_TRERR_LLEAVE);

#ifdef LUA_USE_ASSERT
  rec_check_slots(J);
  rec_check_ir(J);
#endif

#if LJ_HASPROFILE
  rec_profile_ins(J, pc);
#endif

  /* Keep a copy of the runtime values of var/num/str operands. */
#define rav	(&ix.valv)
#define rbv	(&ix.tabv)
#define rcv	(&ix.keyv)

  lbase = J->L->base;
  ins = *pc;
  op = bc_op(ins);
  ra = bc_a(ins);
  ix.val = 0;
  switch (bcmode_a(op)) {
  case BCMvar:
    copyTV(J->L, rav, &lbase[ra]); ix.val = ra = getslot(J, ra); break;
  default: break;  /* Handled later. */
  }
  rb = bc_b(ins);
  rc = bc_c(ins);
  switch (bcmode_b(op)) {
  case BCMnone: rb = 0; rc = bc_d(ins); break;  /* Upgrade rc to 'rd'. */
  case BCMvar:
    copyTV(J->L, rbv, &lbase[rb]); ix.tab = rb = getslot(J, rb); break;
  default: break;  /* Handled later. */
  }
  switch (bcmode_c(op)) {
  case BCMvar:
    copyTV(J->L, rcv, &lbase[rc]); ix.key = rc = getslot(J, rc); break;
  case BCMpri: setpriV(rcv, ~rc); ix.key = rc = TREF_PRI(IRT_NIL+rc); break;
  case BCMnum: { cTValue *tv = proto_knumtv(J->pt, rc);
    copyTV(J->L, rcv, tv); ix.key = rc = tvisint(tv) ? lj_ir_kint(J, intV(tv)) :
    tv->u32.hi == LJ_KEYINDEX ? (lj_ir_kint(J, 0) | TREF_KEYINDEX) :
    lj_ir_knumint(J, numV(tv)); } break;
  case BCMstr: { GCstr *s = gco2str(proto_kgc(J->pt, ~(ptrdiff_t)rc));
    setstrV(J->L, rcv, s); ix.key = rc = lj_ir_kstr(J, s); } break;
  default: break;  /* Handled later. */
  }

  switch (op) {

  /* -- Comparison ops ---------------------------------------------------- */

  case BC_ISLT: case BC_ISGE: case BC_ISLE: case BC_ISGT:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, ((int)op & 2) ? MM_le : MM_lt);
      break;
    }
#endif
    /* Emit nothing for two numeric or string consts. */
    if (!(tref_isk2(ra,rc) && tref_isnumber_str(ra) && tref_isnumber_str(rc))) {
      IRType ta = tref_isinteger(ra) ? IRT_INT : tref_type(ra);
      IRType tc = tref_isinteger(rc) ? IRT_INT : tref_type(rc);
      int irop;
      if (ta != tc) {
	/* Widen mixed number/int comparisons to number/number comparison. */
	if (ta == IRT_INT && tc == IRT_NUM) {
	  ra = emitir(IRTN(IR_CONV), ra, IRCONV_NUM_INT);
	  ta = IRT_NUM;
	} else if (ta == IRT_NUM && tc == IRT_INT) {
	  rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
	} else if (LJ_52) {
	  ta = IRT_NIL;  /* Force metamethod for different types. */
	} else if (!((ta == IRT_FALSE || ta == IRT_TRUE) &&
		     (tc == IRT_FALSE || tc == IRT_TRUE))) {
	  break;  /* Interpreter will throw for two different types. */
	}
      }
      rec_comp_prep(J);
      irop = (int)op - (int)BC_ISLT + (int)IR_LT;
      if (ta == IRT_NUM) {
	if ((irop & 1)) irop ^= 4;  /* ISGE/ISGT are unordered. */
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 5;
      } else if (ta == IRT_INT) {
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 1;
      } else if (ta == IRT_STR) {
	if (!lj_ir_strcmp(strV(rav), strV(rcv), (IROp)irop)) irop ^= 1;
	ra = lj_ir_call(J, IRCALL_lj_str_cmp, ra, rc);
	rc = lj_ir_kint(J, 0);
	ta = IRT_INT;
      } else {
	rec_mm_comp(J, &ix, (int)op);
	break;
      }
      emitir(IRTG(irop, ta), ra, rc);
      rec_comp_fixup(J, J->pc, ((int)op ^ irop) & 1);
    }
    break;

  case BC_ISEQV: case BC_ISNEV:
  case BC_ISEQS: case BC_ISNES:
  case BC_ISEQN: case BC_ISNEN:
  case BC_ISEQP: case BC_ISNEP:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, MM_eq);
      break;
    }
#endif
    /* Emit nothing for two non-table, non-udata consts. */
    if (!(tref_isk2(ra, rc) && !(tref_istab(ra) || tref_isudata(ra)))) {
      int diff;
      rec_comp_prep(J);
      diff = lj_record_objcmp(J, ra, rc, rav, rcv);
      if (diff == 2 || !(tref_istab(ra) || tref_isudata(ra)))
	rec_comp_fixup(J, J->pc, ((int)op & 1) == !diff);
      else if (diff == 1)  /* Only check __eq if different, but same type. */
	rec_mm_equal(J, &ix, (int)op);
    }
    break;

  /* -- Unary test and copy ops ------------------------------------------- */

  case BC_ISTC: case BC_ISFC:
    if ((op & 1) == tref_istruecond(rc))
      rc = 0;  /* Don't store if condition is not true. */
    /* fallthrough */
  case BC_IST: case BC_ISF:  /* Type specialization suffices. */
    if (bc_a(pc[1]) < J->maxslot)
      J->maxslot = bc_a(pc[1]);  /* Shrink used slots. */
    break;

  case BC_ISTYPE: case BC_ISNUM:
    /* These coercions need to correspond with lj_meta_istype(). */
    if (LJ_DUALNUM && rc == ~LJ_TNUMX+1)
      ra = lj_opt_narrow_toint(J, ra);
    else if (rc == ~LJ_TNUMX+2)
      ra = lj_ir_tonum(J, ra);
    else if (rc == ~LJ_TSTR+1)
      ra = lj_ir_tostr(J, ra);
    /* else: type specialization suffices. */
    J->base[bc_a(ins)] = ra;
    break;

  /* -- Unary ops --------------------------------------------------------- */

  case BC_NOT:
    /* Type specialization already forces const result. */
    rc = tref_istruecond(rc) ? TREF_FALSE : TREF_TRUE;
    break;

  case BC_LEN:
    if (tref_isstr(rc))
      rc = emitir(IRTI(IR_FLOAD), rc, IRFL_STR_LEN);
    else if (!LJ_52 && tref_istab(rc))
      rc = emitir(IRTI(IR_ALEN), rc, TREF_NIL);
    else
      rc = rec_mm_len(J, rc, rcv);
    break;

  /* -- Arithmetic ops ---------------------------------------------------- */

  case BC_UNM:
    if (tref_isnumber_str(rc)) {
      rc = lj_opt_narrow_unm(J, rc, rcv);
    } else {
      ix.tab = rc;
      copyTV(J->L, &ix.tabv, rcv);
      rc = rec_mm_arith(J, &ix, MM_unm);
    }
    break;

  case BC_ADDNV: case BC_SUBNV: case BC_MULNV: case BC_DIVNV: case BC_MODNV:
    /* Swap rb/rc and rbv/rcv. rav is temp. */
    ix.tab = rc; ix.key = rc = rb; rb = ix.tab;
    copyTV(J->L, rav, rbv);
    copyTV(J->L, rbv, rcv);
    copyTV(J->L, rcv, rav);
    if (op == BC_MODNV)
      goto recmod;
    /* fallthrough */
  case BC_ADDVN: case BC_SUBVN: case BC_MULVN: case BC_DIVVN:
  case BC_ADDVV: case BC_SUBVV: case BC_MULVV: case BC_DIVVV: {
    MMS mm = bcmode_mm(op);
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv,
			       (int)mm - (int)MM_add + (int)IR_ADD);
    else
      rc = rec_mm_arith(J, &ix, mm);
    break;
    }

  case BC_MODVN: case BC_MODVV:
  recmod:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_mod(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_mod);
    break;

  case BC_POW:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv, IR_POW);
    else
      rc = rec_mm_arith(J, &ix, MM_pow);
    break;

  /* -- Miscellaneous ops ------------------------------------------------- */

  case BC_CAT:
    rc = rec_cat(J, rb, rc);
    break;

  /* -- Constant and move ops --------------------------------------------- */

  case BC_MOV:
    /* Clear gap of method call to avoid resurrecting previous refs. */
    if (ra > J->maxslot) {
#if LJ_FR2
      memset(J->base + J->maxslot, 0, (ra - J->maxslot) * sizeof(TRef));
#else
      J->base[ra-1] = 0;
#endif
    }
    break;
  case BC_KSTR: case BC_KNUM: case BC_KPRI:
    break;
  case BC_KSHORT:
    rc = lj_ir_kint(J, (int32_t)(int16_t)rc);
    break;
  case BC_KNIL:
    if (LJ_FR2 && ra > J->maxslot)
      J->base[ra-1] = 0;
    while (ra <= rc)
      J->base[ra++] = TREF_NIL;
    if (rc >= J->maxslot) J->maxslot = rc+1;
    break;
#if LJ_HASFFI
  case BC_KCDATA:
    rc = lj_ir_kgc(J, proto_kgc(J->pt, ~(ptrdiff_t)rc), IRT_CDATA);
    break;
#endif

  /* -- Upvalue and function ops ------------------------------------------ */

  case BC_UGET:
    rc = rec_upvalue(J, rc, 0);
    break;
  case BC_USETV: case BC_USETS: case BC_USETN: case BC_USETP:
    rec_upvalue(J, ra, rc);
    break;

  /* -- Table ops --------------------------------------------------------- */

  case BC_GGET: case BC_GSET:
    settabV(J->L, &ix.tabv, tabref(J->fn->l.env));
    ix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), getcurrf(J), IRFL_FUNC_ENV);
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TGETB: case BC_TSETB:
    setintV(&ix.keyv, (int32_t)rc);
    ix.key = lj_ir_kint(J, (int32_t)rc);
    /* fallthrough */
  case BC_TGETV: case BC_TGETS: case BC_TSETV: case BC_TSETS:
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;
  case BC_TGETR: case BC_TSETR:
    ix.idxchain = 0;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TSETM:
    rec_tsetm(J, ra, (BCReg)(J->L->top - J->L->base), (int32_t)rcv->u32.lo);
    J->maxslot = ra;  /* The table slot at ra-1 is the highest used slot. */
    break;

  case BC_TNEW:
    rc = rec_tnew(J, rc);
    break;
  case BC_TDUP:
    rc = emitir(IRTG(IR_TDUP, IRT_TAB),
		lj_ir_ktab(J, gco2tab(proto_kgc(J->pt, ~(ptrdiff_t)rc))), 0);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
    J->rbchash[(rc & (RBCHASH_SLOTS-1))].ref = tref_ref(rc);
    setmref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pc, pc);
    setgcref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
    break;

  /* -- Calls and vararg handling ----------------------------------------- */

  case BC_ITERC:
    J->base[ra] = getslot(J, ra-3);
    J->base[ra+1+LJ_FR2] = getslot(J, ra-2);
    J->base[ra+2+LJ_FR2] = getslot(J, ra-1);
    { /* Do the actual copy now because lj_record_call needs the values. */
      TValue *b = &J->L->base[ra];
      copyTV(J->L, b, b-3);
      copyTV(J->L, b+1+LJ_FR2, b-2);
      copyTV(J->L, b+2+LJ_FR2, b-1);
    }
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  /* L->top is set to L->base+ra+rc+NARGS-1+1. See lj_dispatch_ins(). */
  case BC_CALLM:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALL:
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_CALLMT:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALLT:
    lj_record_tailcall(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_VARG:
    rec_varg(J, ra, (ptrdiff_t)rb-1);
    break;

  /* -- Returns ----------------------------------------------------------- */

  case BC_RETM:
    /* L->top is set to L->base+ra+rc+NRESULTS-1, see lj_dispatch_ins(). */
    rc = (BCReg)(J->L->top - J->L->base) - ra + 1;
    /* fallthrough */
  case BC_RET: case BC_RET0: case BC_RET1:
#if LJ_HASPROFILE
    rec_profile_ret(J);
#endif
    lj_record_ret(J, ra, (ptrdiff_t)rc-1);
    break;

  /* -- Loops and branches ------------------------------------------------ */

  case BC_FORI:
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)
      J->loopref = J->cur.nins;
    break;
  case BC_JFORI:
    lj_assertJ(bc_op(pc[(ptrdiff_t)rc-BCBIAS_J]) == BC_JFORL,
	       "JFORI does not point to JFORL");
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)  /* Link to existing loop. */
      lj_record_stop(J, LJ_TRLINK_ROOT, bc_d(pc[(ptrdiff_t)rc-BCBIAS_J]));
    /* Continue tracing if the loop is not entered. */
    break;

  case BC_FORL:
    rec_loop_interp(J, pc, rec_for(J, pc+((ptrdiff_t)rc-BCBIAS_J), 1));
    break;
  case BC_ITERL:
    rec_loop_interp(J, pc, rec_iterl(J, *pc));
    break;
  case BC_ITERN:
    rec_loop_interp(J, pc, rec_itern(J, ra, rb));
    break;
  case BC_LOOP:
    rec_loop_interp(J, pc, rec_loop(J, ra, 1));
    break;

  case BC_JFORL:
    rec_loop_jit(J, rc, rec_for(J, pc+bc_j(traceref(J, rc)->startins), 1));
    break;
  case BC_JITERL:
    rec_loop_jit(J, rc, rec_iterl(J, traceref(J, rc)->startins));
    break;
  case BC_JLOOP:
    rec_loop_jit(J, rc, rec_loop(J, ra,
				 !bc_isret(bc_op(traceref(J, rc)->startins)) &&
				 bc_op(traceref(J, rc)->startins) != BC_ITERN));
    break;

  case BC_IFORL:
  case BC_IITERL:
  case BC_ILOOP:
  case BC_IFUNCF:
  case BC_IFUNCV:
    lj_trace_err(J, LJ_TRERR_BLACKL);
    break;

  case BC_JMP:
    if (ra < J->maxslot)
      J->maxslot = ra;  /* Shrink used slots. */
    break;

  case BC_ISNEXT:
    rec_isnext(J, ra);
    break;

  /* -- Function headers -------------------------------------------------- */

  case BC_FUNCF:
    rec_func_lua(J);
    break;
  case BC_JFUNCF:
    rec_func_jit(J, rc);
    break;

  case BC_FUNCV:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case BC_JFUNCV:
    /* Cannot happen. No hotcall counting for varag funcs. */
    lj_assertJ(0, "unsupported vararg hotcall");
    break;

  case BC_FUNCC:
  case BC_FUNCCW:
    lj_ffrecord_func(J);
    break;

  default:
    if (op >= BC__MAX) {
      lj_ffrecord_func(J);
      break;
    }
    /* fallthrough */
  case BC_UCLO:
  case BC_FNEW:
    setintV(&J->errinfo, (int32_t)op);
    lj_trace_err_info(J, LJ_TRERR_NYIBC);
    break;
  }

  /* rc == 0 if we have no result yet, e.g. pending __index metamethod call. */
  if (bcmode_a(op) == BCMdst && rc) {
    J->base[ra] = rc;
    if (ra >= J->maxslot) {
#if LJ_FR2
      if (ra > J->maxslot) J->base[ra-1] = 0;
#endif
      J->maxslot = ra+1;
    }
  }

#undef rav
#undef rbv
#undef rcv

  /* Limit the number of recorded IR instructions and constants. */
  if (J->cur.nins > REF_FIRST+(IRRef)J->param[JIT_P_maxrecord] ||
      J->cur.nk < REF_BIAS-(IRRef)J->param[JIT_P_maxirconst])
    lj_trace_err(J, LJ_TRERR_TRACEOV);
}